

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

value_t * alloc_value(zt_gc_t *gc,value_vtbl_t *vtbl)

{
  value_vtbl_t *in_RSI;
  zt_gc_t *in_RDI;
  value_t *value;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  value_t *local_8;
  
  if (in_RSI == (value_vtbl_t *)0x0) {
    local_8 = (value_t *)0x0;
  }
  else {
    local_8 = (value_t *)zt_calloc_p(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_8->vtbl = in_RSI;
    zt_gc_prepare(in_RDI,local_8);
    printf("Allocating: %p\n",local_8);
  }
  return local_8;
}

Assistant:

static value_t *
alloc_value(zt_gc_t * gc, value_vtbl_t * vtbl) {
    value_t     * value;
    if (vtbl == NULL) {
        return NULL;
    }
    value = zt_callocs(vtbl->size, 1);
    value->vtbl = vtbl;

    zt_gc_prepare(gc, (void *)value); /*  */
    printf("Allocating: %p\n", (void *)value);
    return value;
}